

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpudpv4transmitter.cpp
# Opt level: O1

void __thiscall jrtplib::RTPUDPv4Transmitter::LeaveAllMulticastGroups(RTPUDPv4Transmitter *this)

{
  uint uVar1;
  HashElement *pHVar2;
  HashElement *pHVar3;
  RTPMemoryManager *pRVar4;
  undefined8 in_RAX;
  uint uVar5;
  ip_mreq mreq;
  undefined8 local_28;
  
  if (this->init == true) {
    if (this->created == true) {
      pHVar2 = (this->multicastgroups).firsthashelem;
      (this->multicastgroups).curhashelem = pHVar2;
      local_28 = in_RAX;
      while (pHVar2 != (HashElement *)0x0) {
        uVar1 = pHVar2->element;
        uVar5 = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
        uVar1 = this->mcastifaceIP;
        local_28 = CONCAT44(uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 |
                            uVar1 << 0x18,uVar5);
        setsockopt(this->rtpsock,0,0x24,&local_28,8);
        if (this->rtpsock != this->rtcpsock) {
          uVar1 = this->mcastifaceIP;
          local_28 = CONCAT44(uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 |
                              uVar1 << 0x18,uVar5);
          setsockopt(this->rtcpsock,0,0x24,&local_28,8);
        }
        pHVar2 = (this->multicastgroups).curhashelem;
        if (pHVar2 != (HashElement *)0x0) {
          (this->multicastgroups).curhashelem = pHVar2->listnext;
        }
        pHVar2 = (this->multicastgroups).curhashelem;
      }
      memset((this->multicastgroups).table,0,0x103e8);
      pHVar2 = (this->multicastgroups).firsthashelem;
      while (pHVar2 != (HashElement *)0x0) {
        pHVar3 = pHVar2->listnext;
        pRVar4 = (this->multicastgroups).super_RTPMemoryObject.mgr;
        if (pRVar4 == (RTPMemoryManager *)0x0) {
          operator_delete(pHVar2,0x28);
          pHVar2 = pHVar3;
        }
        else {
          (**(code **)(*(long *)pRVar4 + 0x18))(pRVar4,pHVar2);
          pHVar2 = pHVar3;
        }
      }
      (this->multicastgroups).firsthashelem = (HashElement *)0x0;
      (this->multicastgroups).lasthashelem = (HashElement *)0x0;
    }
  }
  return;
}

Assistant:

void RTPUDPv4Transmitter::LeaveAllMulticastGroups()
{
	if (!init)
		return;
	
	MAINMUTEX_LOCK
	if (created)
	{
		multicastgroups.GotoFirstElement();
		while (multicastgroups.HasCurrentElement())
		{
			uint32_t mcastIP;
			int status = 0;

			mcastIP = multicastgroups.GetCurrentElement();
			
			RTPUDPV4TRANS_MCASTMEMBERSHIP(rtpsock,IP_DROP_MEMBERSHIP,mcastIP,status);
			if (rtpsock != rtcpsock) // no need to leave multicast group twice when multiplexing
				RTPUDPV4TRANS_MCASTMEMBERSHIP(rtcpsock,IP_DROP_MEMBERSHIP,mcastIP,status);
			JRTPLIB_UNUSED(status);

			multicastgroups.GotoNextElement();
		}
		multicastgroups.Clear();
	}
	MAINMUTEX_UNLOCK
}